

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::elemlist<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,bool legacy)

{
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *this;
  _Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *this_00;
  bool bVar1;
  Type TVar2;
  string_view expected;
  string local_e8;
  undefined1 local_c8 [8];
  MaybeResult<wasm::Type> type;
  undefined1 local_80 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> func;
  
  maybeReftype<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Type> *)local_c8,ctx);
  if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    expected._M_str = "func";
    expected._M_len = 4;
    bVar1 = Lexer::takeKeyword(&ctx->in,expected);
    if (!bVar1 && !legacy) {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"expected element list",
                 (allocator<char> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      Lexer::err((Err *)local_c8,&ctx->in,&local_e8);
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      return __return_storage_ptr__;
    }
    TVar2 = ParseModuleTypesCtx::makeFuncElemList(ctx);
    this = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    while (maybeFuncidx<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)this,ctx),
          func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80,
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                   (string *)local_80);
        std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
LAB_00c530ae:
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        goto LAB_00c530cc;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage(this);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    *(uintptr_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = TVar2.id;
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                    ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_c8);
    if (func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)local_80,
                 (string *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      goto LAB_00c530cc;
    }
    this_00 = (_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage(this_00);
    while (maybeElemexpr<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)this_00,ctx)
          , func.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80,
                      (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                   (string *)local_80);
        std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
        goto LAB_00c530ae;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)this_00);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_c8;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
LAB_00c530cc:
  std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ElemListT> elemlist(Ctx& ctx, bool legacy) {
  if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    auto res = ctx.makeElemList(*type);
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(res, *elem);
    }
    return res;
  } else if (ctx.in.takeKeyword("func"sv) || legacy) {
    auto res = ctx.makeFuncElemList();
    while (auto func = maybeFuncidx(ctx)) {
      CHECK_ERR(func);
      ctx.appendFuncElem(res, *func);
    }
    return res;
  }
  return ctx.in.err("expected element list");
}